

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::SignCase::compare(SignCase *this,void **inputs,void **outputs)

{
  float fVar1;
  DataType dataType;
  Precision PVar2;
  int iVar3;
  pointer pSVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ostream *poVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  deUint32 u32;
  HexFloat local_4c;
  undefined1 local_48 [16];
  
  pSVar4 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar4->varType).m_data.basic.type;
  PVar2 = (pSVar4->varType).m_data.basic.precision;
  uVar6 = glu::getDataTypeScalarSize(dataType);
  uVar10 = 0;
  if (dataType - TYPE_FLOAT < 4) {
    uVar9 = 0xffff;
    if (PVar2 != PRECISION_LOWP) {
      uVar9 = 0;
    }
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar10;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      fVar1 = *(float *)((long)*inputs + uVar10 * 4);
      uVar6 = -(uint)(fVar1 < 0.0);
      uVar5 = uVar6 & 0xbf800000 | ~uVar6 & -(uint)(0.0 < fVar1) & 0x3f800000;
      local_48 = ZEXT416(uVar5);
      uVar6 = *(uint *)((long)*outputs + uVar10 * 4);
      uVar11 = uVar5 - uVar6;
      if (uVar5 < uVar6) {
        uVar11 = -(uVar5 - uVar6);
      }
      if (uVar9 < uVar11) {
        poVar8 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar10);
        poVar8 = std::operator<<(poVar8,"] = ");
        local_4c.value = (float)local_48._0_4_;
        poVar8 = Functional::operator<<(poVar8,&local_4c);
        poVar8 = std::operator<<(poVar8," with ULP threshold ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,", got ULP diff ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        return false;
      }
    }
  }
  else {
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar10;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = *(int *)((long)*inputs + uVar10 * 4);
      uVar6 = (uint)(iVar3 != 0);
      if (iVar3 < 0) {
        uVar6 = 0xffffffff;
      }
      if (*(uint *)((long)*outputs + uVar10 * 4) != uVar6) {
        poVar8 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar10);
        poVar8 = std::operator<<(poVar8,"] = ");
        std::ostream::operator<<(poVar8,uVar6);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Both highp and mediump should be able to represent -1, 0, and +1 exactly
			const deUint32 maxUlpDiff = precision == glu::PRECISION_LOWP ? getMaxUlpDiffFromBits(getMinMantissaBits(precision)) : 0;

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref0		= in0 < 0.0f ? -1.0f :
											  in0 > 0.0f ? +1.0f : 0.0f;
				const deUint32	ulpDiff0	= getUlpDiff(out0, ref0);

				if (ulpDiff0 > maxUlpDiff)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " with ULP threshold " << maxUlpDiff << ", got ULP diff " << ulpDiff0;
					return false;
				}
			}
		}
		else
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int	in0		= ((const int*)inputs[0])[compNdx];
				const int	out0	= ((const int*)outputs[0])[compNdx];
				const int	ref0	= in0 < 0 ? -1 :
									  in0 > 0 ? +1 : 0;

				if (out0 != ref0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << ref0;
					return false;
				}
			}
		}

		return true;
	}